

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O1

StringHashPair GeneratedSaxParser::Utils::calculateStringHashWithNamespace(ParserChar *text)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  StringHashPair SVar6;
  
  uVar2 = 0;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (*text == ':') {
      if (text[1] != '\0') {
        text = text + 1;
        uVar5 = 0;
        uVar2 = uVar3;
      }
    }
    else if (*text == '\0') {
      SVar6.second = uVar3;
      SVar6.first = uVar2;
      return SVar6;
    }
    cVar1 = *text;
    text = text + 1;
    uVar3 = (long)cVar1 + uVar5 * 0x10;
    uVar4 = (uint)uVar3 & 0xf0000000;
    uVar3 = ~(ulong)uVar4 & (uVar4 >> 0x18 ^ uVar3);
  } while( true );
}

Assistant:

StringHashPair Utils::calculateStringHashWithNamespace( const ParserChar* text )
    {
        StringHash h = 0;
        StringHash g;
        const ParserChar* pos = text;
        StringHashPair pair;
        pair.first = 0;

        while (*pos != 0) {
            if (*pos == ':' && pos[1] != 0) {
                pair.first = h;
                h = 0;
                pos++;
            }
            h = (h << 4) + *pos++;
            if ((g = (h & 0xf0000000)) != 0)
                h ^= g >> 24;
            h &= ~g;
        }
        pair.second = h;
        return pair;
    }